

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ComputeInternalJacobians
          (ChElementHexaANCF_3813_9 *this,double Kfactor,double Rfactor)

{
  ChMatrixNM<double,_33,_33> result;
  Brick9_Jacobian formula;
  
  Eigen::DenseBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_> *)&this->m_JacobianMatrix);
  this->m_InteCounter = 0;
  formula.super_ChIntegrable3D<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>._vptr_ChIntegrable3D =
       (_func_int **)&PTR__ChIntegrable3D_01181d80;
  formula.m_element = this;
  formula.m_Kfactor = Kfactor;
  formula.m_Rfactor = Rfactor;
  Eigen::DenseBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_> *)&result);
  ChQuadrature::Integrate3D<Eigen::Matrix<double,33,33,1,33,33>>
            ((Matrix<double,_33,_33,_1,_33,_33> *)&result,
             &formula.super_ChIntegrable3D<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>,-1.0,1.0,-1.0,
             1.0,-1.0,1.0,2);
  Eigen::MatrixBase<Eigen::Matrix<double,33,33,1,33,33>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,33,33,1,33,33>> *)&this->m_JacobianMatrix,
             (MatrixBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_> *)&result);
  return;
}

Assistant:

void ChElementHexaANCF_3813_9::ComputeInternalJacobians(double Kfactor, double Rfactor) {
    m_JacobianMatrix.setZero();
    m_InteCounter = 0;
    Brick9_Jacobian formula(this, Kfactor, Rfactor);
    ChMatrixNM<double, 33, 33> result;
    result.setZero();
    ChQuadrature::Integrate3D<ChMatrixNM<double, 33, 33>>(result,   // result of integration
                                                          formula,  // integrand formula
                                                          -1, 1,    // x limits
                                                          -1, 1,    // y limits
                                                          -1, 1,    // z limits
                                                          2         // order of integration
    );
    // Accumulate Jacobian
    m_JacobianMatrix += result;
}